

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O0

CHog * __thiscall CHog::visualizationHalf(CHog *this,Mat *image)

{
  int iVar1;
  int iVar2;
  ostream *this_00;
  _OutputArray *in_RDX;
  double local_178;
  Scalar_<double> local_148;
  Size_<int> local_128;
  Point_<int> local_120;
  _InputOutputArray local_118;
  Scalar_<double> local_100;
  Size_<int> local_e0;
  Point_<int> local_d8;
  _InputOutputArray local_d0;
  int local_b8;
  int local_b4;
  int b_1;
  int cellX_1;
  int cellY_1;
  int b;
  int cellX;
  int cellY;
  int maxValue;
  int maxIdx;
  int numOri;
  Point center;
  Point end;
  Point start;
  int pixValue;
  double maxBinValue;
  _InputArray local_68;
  _OutputArray local_40;
  undefined1 local_21;
  Mat *image_local;
  CHog *this_local;
  Mat *visual;
  
  image_local = image;
  this_local = this;
  this_00 = std::operator<<((ostream *)&std::cout,"visualization");
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  local_21 = 0;
  cv::Mat::Mat((Mat *)this,*(int *)(image + 0x20) * *(int *)(image + 0x1c),
               *(int *)(image + 0x20) * *(int *)(image + 0x18),0x10);
  if ((in_RDX->super__InputArray).sz == (Size)0x0) {
    maxBinValue = 0.0;
    cv::_InputArray::_InputArray(&local_68,&maxBinValue);
    cv::noArray();
    cv::Mat::setTo((_InputArray *)this,&local_68);
    cv::_InputArray::~_InputArray(&local_68);
  }
  else {
    cv::_OutputArray::_OutputArray(&local_40,(Mat *)this);
    cv::Mat::copyTo(in_RDX);
    cv::_OutputArray::~_OutputArray(&local_40);
  }
  stack0xffffffffffffff88 = -3.4028234663852886e+38;
  cv::Point_<int>::Point_(&end);
  cv::Point_<int>::Point_(&center);
  cv::Point_<int>::Point_((Point_<int> *)&maxIdx);
  for (b = 1; b < *(int *)(image + 0x1c) + 1; b = b + 1) {
    for (cellY_1 = 1; cellY_1 < *(int *)(image + 0x18) + 1; cellY_1 = cellY_1 + 1) {
      for (cellX_1 = 0;
          cellX_1 < *(int *)(*(long *)(*(long *)image + (long)b * 8) + (long)cellY_1 * 0x30 + 0x18);
          cellX_1 = cellX_1 + 1) {
        if (*(double *)
             (*(long *)(*(long *)(*(long *)image + (long)b * 8) + (long)cellY_1 * 0x30) +
             (long)cellX_1 * 8) <= stack0xffffffffffffff88) {
          local_178 = stack0xffffffffffffff88;
        }
        else {
          local_178 = *(double *)
                       (*(long *)(*(long *)(*(long *)image + (long)b * 8) + (long)cellY_1 * 0x30) +
                       (long)cellX_1 * 8);
        }
        unique0x00006b80 = local_178;
      }
    }
  }
  for (b_1 = 1; b_1 < *(int *)(image + 0x1c) + 1; b_1 = b_1 + 1) {
    numOri = (b_1 + -1) * *(int *)(image + 0x20) + b_1 / 2;
    for (local_b4 = 1; local_b4 < *(int *)(image + 0x18) + 1; local_b4 = local_b4 + 1) {
      maxValue = *(int *)(*(long *)(*(long *)image + (long)b_1 * 8) + (long)local_b4 * 0x30 + 0x18);
      cellY = 0;
      cellX = (int)((**(double **)
                       (*(long *)(*(long *)image + (long)b_1 * 8) + (long)local_b4 * 0x30) /
                    stack0xffffffffffffff88) * 255.0);
      maxIdx = (local_b4 + -1) * *(int *)(image + 0x20) + local_b4 / 2;
      for (local_b8 = 0; local_b8 < maxValue; local_b8 = local_b8 + 1) {
        iVar1 = (int)((*(double *)
                        (*(long *)(*(long *)(*(long *)image + (long)b_1 * 8) + (long)local_b4 * 0x30
                                  ) + (long)local_b8 * 8) / stack0xffffffffffffff88) * 255.0);
        if (cellX < iVar1) {
          cellY = local_b8;
          cellX = iVar1;
        }
        else {
          cv::_InputOutputArray::_InputOutputArray(&local_d0,(Mat *)this);
          cv::Point_<int>::Point_(&local_d8,(Point_<int> *)&maxIdx);
          cv::Size_<int>::Size_(&local_e0,0,*(int *)(image + 0x20) / 2);
          iVar2 = local_b8 * (int)(0xb4 / (long)maxValue);
          cv::Scalar_<double>::Scalar_(&local_100,0.0,(double)iVar1,(double)iVar1,0.0);
          cv::ellipse((double)iVar2,0,0x4076800000000000,&local_d0,&local_d8,&local_e0,&local_100,
                      0xffffffff,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_d0);
        }
      }
      cv::_InputOutputArray::_InputOutputArray(&local_118,(Mat *)this);
      cv::Point_<int>::Point_(&local_120,(Point_<int> *)&maxIdx);
      cv::Size_<int>::Size_(&local_128,0,*(int *)(image + 0x20) / 2);
      iVar1 = cellY * (int)(0xb4 / (long)maxValue);
      cv::Scalar_<double>::Scalar_(&local_148,0.0,(double)cellX,(double)cellX,0.0);
      cv::ellipse((double)iVar1,0,0x4076800000000000,&local_118,&local_120,&local_128,&local_148,
                  0xffffffff,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_118);
    }
  }
  return this;
}

Assistant:

cv::Mat CHog::visualizationHalf(cv::Mat image)
{
    cout<<"visualization"<<endl;
    cv::Mat visual(cellSize*numCellY, cellSize*numCellX, CV_8UC3);
    if(image.data!=NULL)
        image.copyTo(visual);
    else
        visual.setTo(0);
    double maxBinValue = -FLT_MAX;
    int pixValue;
    cv::Point start, end, center;
    int numOri, maxIdx, maxValue;
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            for(int b = 0; b<numOri; b++)
                maxBinValue = hist[cellY][cellX].cellBinsHalf[b]>maxBinValue ? hist[cellY][cellX].cellBinsHalf[b] : maxBinValue;
        }
    }
    for(int cellY = 1; cellY<numCellY+1; cellY++)
    {
        center.y = (cellY-1) * cellSize + cellY/2;
        for(int cellX = 1; cellX<numCellX+1; cellX++)
        {
            numOri = hist[cellY][cellX].numOriHalf;
            maxIdx = 0;
            maxValue = hist[cellY][cellX].cellBinsHalf[0]/maxBinValue*255;
            center.x = (cellX-1) * cellSize + cellX/2;

            for(int b = 0; b<numOri; b++)
            {
                pixValue = hist[cellY][cellX].cellBinsHalf[b]/maxBinValue*255;
                if(pixValue>maxValue)
                {
                    maxValue = pixValue;
                    maxIdx = b;
                }
                else
                    cv::ellipse(visual, center, cv::Size(0, cellSize/2), b*(180/numOri), 0, 360, cv::Scalar(0, pixValue, pixValue), -1);
            }
            cv::ellipse(visual, center, cv::Size(0, cellSize/2), maxIdx*(180/numOri), 0, 360, cv::Scalar(0, maxValue, maxValue), -1);
            //cv::line(visual, cv::Point((cellX-1) * cellSize, 0), cv::Point((cellX-1) * cellSize, imgHeight), cv::Scalar(255,0,0));
        }
        //cv::line(visual, cv::Point(0, (cellY-1) * cellSize), cv::Point(imgWidth, (cellY-1) * cellSize), cv::Scalar(255,0,0));
    }
    return visual;
}